

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O3

Vec_Ptr_t * Nwk_ManDfs(Nwk_Man_t *pNtk)

{
  Nwk_Obj_t *pObj;
  uint uVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  Nwk_ManIncrementTravId(pNtk);
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vNodes->pArray = ppvVar2;
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      pObj = (Nwk_Obj_t *)pVVar3->pArray[lVar4];
      if (pObj != (Nwk_Obj_t *)0x0) {
        uVar1 = *(uint *)&pObj->field_0x20 & 7;
        if (uVar1 == 2) {
          Nwk_ManDfs_rec(pObj,vNodes);
        }
        else if (uVar1 == 1) {
          pObj->TravId = pObj->pMan->nTravIds;
          uVar1 = vNodes->nSize;
          if (uVar1 == vNodes->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar2 = (void **)malloc(0x80);
              }
              else {
                ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
              }
              vNodes->pArray = ppvVar2;
              vNodes->nCap = 0x10;
            }
            else {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
              }
              vNodes->pArray = ppvVar2;
              vNodes->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar2 = vNodes->pArray;
          }
          vNodes->nSize = uVar1 + 1;
          ppvVar2[(int)uVar1] = pObj;
        }
      }
      lVar4 = lVar4 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar4 < pVVar3->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Nwk_ManDfs( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i;
    Nwk_ManIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 100 );
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        if ( Nwk_ObjIsCi(pObj) )
        {
            Nwk_ObjSetTravIdCurrent( pObj );
            Vec_PtrPush( vNodes, pObj );
        }
        else if ( Nwk_ObjIsCo(pObj) )
            Nwk_ManDfs_rec( pObj, vNodes );
    }
    return vNodes;
}